

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

int wally_elements_pegin_contract_script_from_bytes
              (uchar *redeem_script,size_t redeem_script_len,uchar *script,size_t script_len,
              uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  ulong __n;
  uchar uVar1;
  int iVar2;
  secp256k1_context_struct *ctx;
  bool bVar3;
  ulong uVar4;
  size_t size_out;
  size_t ser_len;
  size_t opcode_size;
  secp256k1_pubkey *pub_key_combination [2];
  size_t push_size;
  secp256k1_pubkey pub_key_tweaked;
  secp256k1_pubkey pub_key;
  uchar tweak [32];
  secp256k1_pubkey pub_key_from_tweak;
  uchar ser_pub_key [33];
  secp256k1_pubkey pub_key_combined;
  size_t local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  uchar *local_1a8;
  size_t local_1a0;
  secp256k1_pubkey *local_198;
  secp256k1_pubkey *local_190;
  size_t local_180;
  secp256k1_pubkey local_178;
  secp256k1_pubkey local_138;
  uchar local_f8 [32];
  secp256k1_pubkey local_d8;
  uchar local_98 [40];
  secp256k1_pubkey local_70;
  
  ctx = secp_ctx();
  local_1b8 = 0x21;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar2 = -2;
  if ((((flags == 0) && (redeem_script != (uchar *)0x0)) && (redeem_script_len != 0)) &&
     (((script != (uchar *)0x0 && (script_len != 0)) &&
      ((bytes_out != (uchar *)0x0 && (len == redeem_script_len)))))) {
    bVar3 = false;
    local_1b0 = redeem_script_len;
    do {
      iVar2 = get_push_size(redeem_script,redeem_script_len,false,&local_1c0);
      if (iVar2 == 0) {
        iVar2 = get_push_size(redeem_script,redeem_script_len,true,&local_1a0);
        if (iVar2 != 0) {
          return iVar2;
        }
        __n = local_1a0 + local_1c0;
        uVar4 = redeem_script_len - __n;
        if (redeem_script_len < __n) {
          return -2;
        }
        if ((local_1c0 == 0x21 && local_1a0 == 1) && !bVar3) {
          local_1a8 = bytes_out;
          iVar2 = pubkey_parse(&local_138,redeem_script + 1,0x21);
          if (iVar2 == 0) {
            return -1;
          }
          local_178.data[0x30] = local_138.data[0x30];
          local_178.data[0x31] = local_138.data[0x31];
          local_178.data[0x32] = local_138.data[0x32];
          local_178.data[0x33] = local_138.data[0x33];
          local_178.data[0x34] = local_138.data[0x34];
          local_178.data[0x35] = local_138.data[0x35];
          local_178.data[0x36] = local_138.data[0x36];
          local_178.data[0x37] = local_138.data[0x37];
          local_178.data[0x38] = local_138.data[0x38];
          local_178.data[0x39] = local_138.data[0x39];
          local_178.data[0x3a] = local_138.data[0x3a];
          local_178.data[0x3b] = local_138.data[0x3b];
          local_178.data[0x3c] = local_138.data[0x3c];
          local_178.data[0x3d] = local_138.data[0x3d];
          local_178.data[0x3e] = local_138.data[0x3e];
          local_178.data[0x3f] = local_138.data[0x3f];
          local_178.data[0x20] = local_138.data[0x20];
          local_178.data[0x21] = local_138.data[0x21];
          local_178.data[0x22] = local_138.data[0x22];
          local_178.data[0x23] = local_138.data[0x23];
          local_178.data[0x24] = local_138.data[0x24];
          local_178.data[0x25] = local_138.data[0x25];
          local_178.data[0x26] = local_138.data[0x26];
          local_178.data[0x27] = local_138.data[0x27];
          local_178.data[0x28] = local_138.data[0x28];
          local_178.data[0x29] = local_138.data[0x29];
          local_178.data[0x2a] = local_138.data[0x2a];
          local_178.data[0x2b] = local_138.data[0x2b];
          local_178.data[0x2c] = local_138.data[0x2c];
          local_178.data[0x2d] = local_138.data[0x2d];
          local_178.data[0x2e] = local_138.data[0x2e];
          local_178.data[0x2f] = local_138.data[0x2f];
          local_178.data[0x10] = local_138.data[0x10];
          local_178.data[0x11] = local_138.data[0x11];
          local_178.data[0x12] = local_138.data[0x12];
          local_178.data[0x13] = local_138.data[0x13];
          local_178.data[0x14] = local_138.data[0x14];
          local_178.data[0x15] = local_138.data[0x15];
          local_178.data[0x16] = local_138.data[0x16];
          local_178.data[0x17] = local_138.data[0x17];
          local_178.data[0x18] = local_138.data[0x18];
          local_178.data[0x19] = local_138.data[0x19];
          local_178.data[0x1a] = local_138.data[0x1a];
          local_178.data[0x1b] = local_138.data[0x1b];
          local_178.data[0x1c] = local_138.data[0x1c];
          local_178.data[0x1d] = local_138.data[0x1d];
          local_178.data[0x1e] = local_138.data[0x1e];
          local_178.data[0x1f] = local_138.data[0x1f];
          local_178.data[0] = local_138.data[0];
          local_178.data[1] = local_138.data[1];
          local_178.data[2] = local_138.data[2];
          local_178.data[3] = local_138.data[3];
          local_178.data[4] = local_138.data[4];
          local_178.data[5] = local_138.data[5];
          local_178.data[6] = local_138.data[6];
          local_178.data[7] = local_138.data[7];
          local_178.data[8] = local_138.data[8];
          local_178.data[9] = local_138.data[9];
          local_178.data[10] = local_138.data[10];
          local_178.data[0xb] = local_138.data[0xb];
          local_178.data[0xc] = local_138.data[0xc];
          local_178.data[0xd] = local_138.data[0xd];
          local_178.data[0xe] = local_138.data[0xe];
          local_178.data[0xf] = local_138.data[0xf];
          iVar2 = wally_hmac_sha256(redeem_script + 1,0x21,script,script_len,local_f8,0x20);
          if (iVar2 != 0) {
            return iVar2;
          }
          iVar2 = secp256k1_ec_pubkey_tweak_add(ctx,&local_178,local_f8);
          if (iVar2 == 0) {
            return -1;
          }
          iVar2 = pubkey_serialize(local_98,&local_1b8,&local_178,0x102);
          bytes_out = local_1a8;
          if (iVar2 == 0) {
            return -1;
          }
          iVar2 = wally_script_push_from_bytes
                            (local_98,local_1b8,0,local_1a8,redeem_script_len,&local_180);
          if (iVar2 != 0) {
            return iVar2;
          }
          iVar2 = secp256k1_ec_pubkey_create(ctx,&local_d8,local_f8);
          if (iVar2 == 0) {
            return -1;
          }
          iVar2 = pubkey_negate(&local_138);
          if (iVar2 == 0) {
            return -1;
          }
          local_190 = &local_178;
          local_198 = &local_138;
          iVar2 = pubkey_combine(&local_70,&local_198,2);
          if (iVar2 == 0) {
            return -1;
          }
          iVar2 = bcmp(&local_70,&local_d8,0x40);
          if (iVar2 != 0) {
            return -1;
          }
        }
        else {
          memcpy(bytes_out,redeem_script,__n);
        }
        redeem_script = redeem_script + __n;
        bytes_out = bytes_out + __n;
      }
      else {
        uVar1 = *redeem_script;
        bVar3 = (bool)(bVar3 | uVar1 == 'g');
        redeem_script = redeem_script + 1;
        *bytes_out = uVar1;
        bytes_out = bytes_out + 1;
        uVar4 = redeem_script_len - 1;
      }
      redeem_script_len = uVar4;
    } while (uVar4 != 0);
    iVar2 = 0;
    if (written != (size_t *)0x0) {
      *written = local_1b0;
    }
  }
  return iVar2;
}

Assistant:

int wally_elements_pegin_contract_script_from_bytes(const unsigned char *redeem_script,
                                                    size_t redeem_script_len,
                                                    const unsigned char *script,
                                                    size_t script_len,
                                                    uint32_t flags,
                                                    unsigned char *bytes_out,
                                                    size_t len,
                                                    size_t *written)
{
    unsigned char ser_pub_key[EC_PUBLIC_KEY_LEN];
    const secp256k1_context *ctx = secp_ctx();
    const unsigned char *p = redeem_script;
    unsigned char *q = bytes_out;
    size_t bytes_len = redeem_script_len;
    size_t ser_len = EC_PUBLIC_KEY_LEN;
    /* For liquidv1 initial watchman template, don't tweak emergency keys. in the future, use flags to change watchmen template */
    bool op_else_found = false;

    int ret;

    if (written)
        *written = 0;

    if (!redeem_script || !redeem_script_len || !script ||
        !script_len || flags || !bytes_out || len != redeem_script_len)
        return WALLY_EINVAL;

    for (;;) {
        size_t size_out;
        ret = script_get_push_size_from_bytes(p, bytes_len, &size_out);
        if (ret == WALLY_OK) {
            size_t offset_siz;
            size_t opcode_size;

            if ((ret = script_get_push_opcode_size_from_bytes(p, bytes_len, &opcode_size)) != WALLY_OK)
                return ret;

            offset_siz = size_out + opcode_size;
            if (bytes_len < offset_siz)
                return WALLY_EINVAL;

            if (opcode_size == 1 && size_out == EC_PUBLIC_KEY_LEN && !op_else_found) {
                unsigned char tweak[HMAC_SHA256_LEN];
                secp256k1_pubkey pub_key;
                secp256k1_pubkey pub_key_from_tweak;
                secp256k1_pubkey pub_key_tweaked;
                const secp256k1_pubkey *pub_key_combination[2];
                secp256k1_pubkey pub_key_combined;
                size_t push_size;

                if (!pubkey_parse(&pub_key, p + 1, EC_PUBLIC_KEY_LEN))
                    return WALLY_ERROR;
                memcpy(&pub_key_tweaked, &pub_key, sizeof(pub_key));
                if ((ret = wally_hmac_sha256(p + 1, EC_PUBLIC_KEY_LEN, script, script_len, tweak, HMAC_SHA256_LEN)) != WALLY_OK)
                    return ret;
                if (!pubkey_tweak_add(ctx, &pub_key_tweaked, tweak))
                    return WALLY_ERROR;
                if (!pubkey_serialize(ser_pub_key, &ser_len, &pub_key_tweaked, PUBKEY_COMPRESSED))
                    return WALLY_ERROR;
                if ((ret = wally_script_push_from_bytes(ser_pub_key, ser_len, 0, q, bytes_len, &push_size)) != WALLY_OK)
                    return ret;
                /* sanity checks as per elementsd */
                if (!pubkey_create(ctx, &pub_key_from_tweak, tweak))
                    return WALLY_ERROR;
                if (!pubkey_negate(&pub_key))
                    return WALLY_ERROR;

                pub_key_combination[0] = &pub_key;
                pub_key_combination[1] = &pub_key_tweaked;
                if (!pubkey_combine(&pub_key_combined, pub_key_combination, 2))
                    return WALLY_ERROR;
                if (memcmp(&pub_key_combined, &pub_key_from_tweak, sizeof(secp256k1_pubkey)) != 0)
                    return WALLY_ERROR;
            }
            else
                memcpy(q, p, offset_siz);
            p += offset_siz;
            q += offset_siz;
            bytes_len -= offset_siz;
        } else {
            if (*p == OP_ELSE && flags == 0) {
                op_else_found = true;
            }

            *q++ = *p++;
            --bytes_len;
        }
        if (bytes_len == 0)
            break;
    }

    if (written)
        *written = redeem_script_len;

    return WALLY_OK;
}